

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,CallFlags callFlags)

{
  bool bVar1;
  uchar local_35;
  short sStack_34;
  unsigned_short uStack_32;
  undefined1 auStack_30 [3];
  OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  CallFlags callFlags_local;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>._1_4_ = callFlags;
  layout.callFlags._2_2_ = givenArgCount;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<short,unsigned_int>
                    (&sStack_34,returnValueRegister);
  if ((((bVar1) &&
       (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                          (&uStack_32,functionRegister), bVar1)) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_char,unsigned_short>
                         (&local_35,layout.callFlags._2_2_), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<Js::CallFlags,Js::CallFlags>
                        ((CallFlags *)auStack_30,
                         layout.super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                         _1_4_), bVar1)) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,&local_35,9,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteCallIFlags(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, CallFlags callFlags)
    {
        OpLayoutT_CallIFlags<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::Assign(layout.callFlags, callFlags))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }